

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_udp.cpp
# Opt level: O3

int __thiscall
miniros::TransportUDP::connect(TransportUDP *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  TransportUDP *pTVar1;
  addrinfo *paVar2;
  bool bVar3;
  int iVar4;
  in_addr_t iVar5;
  in_addr iVar6;
  ostream *poVar7;
  undefined7 extraout_var;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  socklen_t sVar8;
  socklen_t extraout_EDX_01;
  socklen_t extraout_EDX_02;
  socklen_t extraout_EDX_03;
  socklen_t extraout_EDX_04;
  socklen_t extraout_EDX_05;
  socklen_t extraout_EDX_06;
  socklen_t extraout_EDX_07;
  socklen_t extraout_EDX_08;
  socklen_t extraout_EDX_09;
  socklen_t extraout_EDX_10;
  socklen_t extraout_EDX_11;
  socklen_t extraout_EDX_12;
  socklen_t extraout_EDX_13;
  socklen_t extraout_EDX_14;
  socklen_t extraout_EDX_15;
  socklen_t extraout_EDX_16;
  socklen_t extraout_EDX_17;
  socklen_t extraout_EDX_18;
  socklen_t extraout_EDX_19;
  socklen_t extraout_EDX_20;
  socklen_t extraout_EDX_21;
  socklen_t extraout_EDX_22;
  socklen_t extraout_EDX_23;
  ushort uVar9;
  undefined4 in_register_00000034;
  string *host;
  string *psVar10;
  sockaddr *__addr_00;
  sockaddr *psVar11;
  sockaddr *psVar12;
  sockaddr *psVar13;
  _Alloc_hider _Var14;
  sockaddr *__addr_01;
  undefined1 local_1f8 [32];
  sockaddr_in sin;
  addrinfo *addr;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  char *local_198;
  addrinfo *paStack_190;
  ios_base local_138 [264];
  
  host = (string *)CONCAT44(in_register_00000034,__fd);
  psVar13 = (sockaddr *)local_1f8;
  psVar11 = (sockaddr *)local_1f8;
  psVar12 = (sockaddr *)local_1f8;
  __addr_01 = (sockaddr *)((ulong)__addr & 0xffffffff);
  bVar3 = Transport::isHostAllowed(&this->super_Transport,host);
  if (bVar3) {
    _Var14._M_p = (pointer)0x2;
    psVar10 = (string *)0x2;
    iVar4 = socket(2,2,0);
    this->sock_ = iVar4;
    this->connection_id_ = __len;
    if (iVar4 == -1) {
      sVar8 = extraout_EDX;
      if (console::g_initialized == '\0') {
        console::initialize();
        sVar8 = extraout_EDX_04;
      }
      if (connect::loc.initialized_ == false) {
        _ss = (pointer)&local_1a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"miniros.transport_udp","");
        psVar10 = (string *)&ss;
        console::initializeLogLocation(&connect::loc,psVar10,Error);
        _Var14._M_p = _ss;
        sVar8 = extraout_EDX_05;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_ss != &local_1a8) {
          psVar10 = (string *)(local_1a8._M_allocated_capacity + 1);
          operator_delete(_ss,(ulong)psVar10);
          sVar8 = extraout_EDX_06;
        }
      }
      iVar4 = (int)_Var14._M_p;
      if (connect::loc.level_ != Error) {
        connect(iVar4,(sockaddr *)psVar10,sVar8);
        sVar8 = extraout_EDX_07;
      }
      if (connect::loc.logger_enabled_ == true) {
        connect(iVar4,(sockaddr *)psVar10,sVar8);
      }
    }
    else {
      sin.sin_zero[0] = '\0';
      sin.sin_zero[1] = '\0';
      sin.sin_zero[2] = '\0';
      sin.sin_zero[3] = '\0';
      sin.sin_zero[4] = '\0';
      sin.sin_zero[5] = '\0';
      sin.sin_zero[6] = '\0';
      sin.sin_zero[7] = '\0';
      sin.sin_family = 2;
      sin.sin_port = 0;
      sin.sin_addr.s_addr = 0;
      iVar5 = inet_addr((host->_M_dataplus)._M_p);
      uVar9 = (ushort)__addr_01;
      if (iVar5 == 0xffffffff) {
        local_198 = (char *)0x0;
        paStack_190 = (addrinfo *)0x0;
        local_1a8._M_allocated_capacity = 0;
        local_1a8._8_8_ = (sockaddr *)0x0;
        _ss = (pointer)0x0;
        __addr_00 = (sockaddr *)0x0;
        iVar4 = getaddrinfo((host->_M_dataplus)._M_p,(char *)0x0,(addrinfo *)&ss,(addrinfo **)&addr)
        ;
        paVar2 = addr;
        if (iVar4 == 0) {
          for (; paVar2 != (addrinfo *)0x0; paVar2 = paVar2->ai_next) {
            if (paVar2->ai_family == 2) {
              psVar13 = (sockaddr *)paVar2->ai_addr;
              memcpy(&sin,psVar13,(ulong)paVar2->ai_addrlen);
              uVar9 = uVar9 << 8 | uVar9 >> 8;
              sin.sin_port = uVar9;
              sin.sin_family = (sa_family_t)paVar2->ai_family;
              freeaddrinfo((addrinfo *)addr);
              sVar8 = extraout_EDX_03;
              if (console::g_initialized == '\0') {
                console::initialize();
                sVar8 = extraout_EDX_20;
              }
              if (connect(std::__cxx11::string_const&,int,int)::loc.initialized_ == false) {
                local_1f8._0_8_ = (TransportUDP *)(local_1f8 + 0x10);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1f8,"miniros.transport_udp","");
                console::initializeLogLocation
                          (&connect(std::__cxx11::string_const&,int,int)::loc,(string *)local_1f8,
                           Debug);
                psVar13 = psVar12;
                addr = (addrinfo *)local_1f8._0_8_;
                sVar8 = extraout_EDX_21;
                if ((TransportUDP *)local_1f8._0_8_ != (TransportUDP *)(local_1f8 + 0x10)) {
                  psVar13 = (sockaddr *)(local_1f8._16_8_ + 1);
                  operator_delete((void *)local_1f8._0_8_,(ulong)psVar13);
                  sVar8 = extraout_EDX_22;
                }
              }
              if (connect(std::__cxx11::string_const&,int,int)::loc.level_ != Debug) {
                connect((int)addr,psVar13,sVar8);
                sVar8 = extraout_EDX_23;
              }
              if (connect(std::__cxx11::string_const&,int,int)::loc.logger_enabled_ == true) {
                connect(__fd,(sockaddr *)&sin,sVar8);
              }
              goto LAB_0021e956;
            }
          }
          freeaddrinfo((addrinfo *)addr);
          sVar8 = extraout_EDX_02;
          if (console::g_initialized == '\0') {
            console::initialize();
            sVar8 = extraout_EDX_16;
          }
          if (connect(std::__cxx11::string_const&,int,int)::loc.initialized_ == false) {
            local_1f8._0_8_ = (TransportUDP *)(local_1f8 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1f8,"miniros.transport_udp","");
            console::initializeLogLocation
                      (&connect(std::__cxx11::string_const&,int,int)::loc,(string *)local_1f8,Error)
            ;
            __addr_00 = psVar11;
            addr = (addrinfo *)local_1f8._0_8_;
            sVar8 = extraout_EDX_17;
            if ((TransportUDP *)local_1f8._0_8_ != (TransportUDP *)(local_1f8 + 0x10)) {
              __addr_00 = (sockaddr *)(local_1f8._16_8_ + 1);
              operator_delete((void *)local_1f8._0_8_,(ulong)__addr_00);
              sVar8 = extraout_EDX_18;
            }
          }
          if (connect(std::__cxx11::string_const&,int,int)::loc.level_ != Error) {
            connect((int)addr,__addr_00,sVar8);
            sVar8 = extraout_EDX_19;
          }
          if (connect(std::__cxx11::string_const&,int,int)::loc.logger_enabled_ == true) {
            connect(__fd,__addr_00,sVar8);
          }
        }
        else {
          (*(this->super_Transport)._vptr_Transport[8])();
          sVar8 = extraout_EDX_01;
          if (console::g_initialized == '\0') {
            console::initialize();
            sVar8 = extraout_EDX_12;
          }
          if (connect(std::__cxx11::string_const&,int,int)::loc.initialized_ == false) {
            local_1f8._0_8_ = (TransportUDP *)(local_1f8 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1f8,"miniros.transport_udp","");
            console::initializeLogLocation
                      (&connect(std::__cxx11::string_const&,int,int)::loc,(string *)local_1f8,Error)
            ;
            __addr_00 = psVar13;
            this = (TransportUDP *)local_1f8._0_8_;
            sVar8 = extraout_EDX_13;
            if ((TransportUDP *)local_1f8._0_8_ != (TransportUDP *)(local_1f8 + 0x10)) {
              __addr_00 = (sockaddr *)(local_1f8._16_8_ + 1);
              operator_delete((void *)local_1f8._0_8_,(ulong)__addr_00);
              sVar8 = extraout_EDX_14;
            }
          }
          if (connect(std::__cxx11::string_const&,int,int)::loc.level_ != Error) {
            connect((int)this,__addr_00,sVar8);
            sVar8 = extraout_EDX_15;
          }
          if (connect(std::__cxx11::string_const&,int,int)::loc.logger_enabled_ == true) {
            connect(__fd,__addr_00,sVar8);
          }
        }
      }
      else {
        iVar6.s_addr = inet_addr((host->_M_dataplus)._M_p);
        sin.sin_addr.s_addr = iVar6.s_addr;
        uVar9 = uVar9 << 8 | uVar9 >> 8;
LAB_0021e956:
        psVar10 = (string *)&sin;
        sin.sin_port = uVar9;
        _Var14._M_p = (pointer)(ulong)(uint)this->sock_;
        iVar4 = ::connect(this->sock_,(sockaddr *)psVar10,0x10);
        if (iVar4 == 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8._M_local_buf,(host->_M_dataplus)._M_p,
                              host->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(int)__addr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," on socket ",0xb);
          std::ostream::operator<<((ostream *)poVar7,this->sock_);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)&this->cached_remote_host_,(string *)local_1f8);
          pTVar1 = (TransportUDP *)(local_1f8 + 0x10);
          if ((TransportUDP *)local_1f8._0_8_ != pTVar1) {
            operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
          }
          bVar3 = initializeSocket(this);
          if (bVar3) {
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (connect(std::__cxx11::string_const&,int,int)::loc.initialized_ == false) {
              local_1f8._0_8_ = pTVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1f8,"miniros.transport_udp","");
              console::initializeLogLocation
                        (&connect(std::__cxx11::string_const&,int,int)::loc,(string *)local_1f8,
                         Debug);
              if ((TransportUDP *)local_1f8._0_8_ != pTVar1) {
                operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
              }
            }
            if (connect(std::__cxx11::string_const&,int,int)::loc.level_ != Debug) {
              console::setLogLocationLevel(&connect(std::__cxx11::string_const&,int,int)::loc,Debug)
              ;
              console::checkLogLocationEnabled(&connect(std::__cxx11::string_const&,int,int)::loc);
            }
            if (connect(std::__cxx11::string_const&,int,int)::loc.logger_enabled_ == true) {
              console::print((FilterBase *)0x0,
                             connect(std::__cxx11::string_const&,int,int)::loc.logger_,
                             connect(std::__cxx11::string_const&,int,int)::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                             ,0xed,
                             "bool miniros::TransportUDP::connect(const std::string &, int, int)",
                             "Connect succeeded to [%s:%d] on socket [%d]",(host->_M_dataplus)._M_p,
                             __addr_01,(ulong)(uint)this->sock_);
            }
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(local_138);
          return (int)CONCAT71(extraout_var,bVar3);
        }
        sVar8 = extraout_EDX_00;
        if (console::g_initialized == '\0') {
          console::initialize();
          sVar8 = extraout_EDX_08;
        }
        if (connect(std::__cxx11::string_const&,int,int)::loc.initialized_ == false) {
          _ss = (pointer)&local_1a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"miniros.transport_udp","");
          psVar10 = (string *)&ss;
          console::initializeLogLocation
                    (&connect(std::__cxx11::string_const&,int,int)::loc,psVar10,Debug);
          _Var14._M_p = _ss;
          sVar8 = extraout_EDX_09;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_ss != &local_1a8) {
            psVar10 = (string *)(local_1a8._M_allocated_capacity + 1);
            operator_delete(_ss,(ulong)psVar10);
            sVar8 = extraout_EDX_10;
          }
        }
        if (connect(std::__cxx11::string_const&,int,int)::loc.level_ != Debug) {
          connect((int)_Var14._M_p,(sockaddr *)psVar10,sVar8);
          sVar8 = extraout_EDX_11;
        }
        if (connect(std::__cxx11::string_const&,int,int)::loc.logger_enabled_ == true) {
          connect(__fd,__addr_01,sVar8);
        }
        (*(this->super_Transport)._vptr_Transport[8])(this);
      }
    }
  }
  return 0;
}

Assistant:

bool TransportUDP::connect(const std::string& host, int port, int connection_id)
{
  if (!isHostAllowed(host))
    return false; // adios amigo

  sock_ = socket(AF_INET, SOCK_DGRAM, 0);
  connection_id_ = connection_id;

  if (sock_ == ROS_INVALID_SOCKET)
  {
    MINIROS_ERROR("socket() failed with error [%s]",  last_socket_error_string());
    return false;
  }

  sockaddr_in sin = {};
  sin.sin_family = AF_INET;
  if (inet_addr(host.c_str()) == INADDR_NONE)
  {
    struct addrinfo* addr;
    struct addrinfo hints;
    memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_UNSPEC;

    if (getaddrinfo(host.c_str(), NULL, &hints, &addr) != 0)
    {
      close();
      MINIROS_ERROR("couldn't resolve host [%s]", host.c_str());
      return false;
    }

    bool found = false;
    struct addrinfo* it = addr;
    for (; it; it = it->ai_next)
    {
      if (it->ai_family == AF_INET)
      {
        memcpy(&sin, it->ai_addr, it->ai_addrlen);
        sin.sin_family = it->ai_family;
        sin.sin_port = htons(port);

        found = true;
        break;
      }
    }

    freeaddrinfo(addr);

    if (!found)
    {
      MINIROS_ERROR("Couldn't find an AF_INET address for [%s]\n", host.c_str());
      return false;
    }

    MINIROS_DEBUG("Resolved host [%s] to [%s]", host.c_str(), inet_ntoa(sin.sin_addr));
  }
  else
  {
    sin.sin_addr.s_addr = inet_addr(host.c_str()); // already an IP addr
  }

  sin.sin_port = htons(port);

  if (::connect(sock_, (sockaddr *)&sin, sizeof(sin)))
  {
    MINIROS_DEBUG("Connect to udpros host [%s:%d] failed with error [%s]", host.c_str(), port,  last_socket_error_string());
    close();

    return false;
  }

  // from daniel stonier:
#ifdef WIN32
  // This is hackish, but windows fails at recv() if its slow to connect (e.g. happens with wireless)
  // recv() needs to check if its connected or not when its asynchronous?
  Sleep(100);
#endif

  std::stringstream ss;
  ss << host << ":" << port << " on socket " << sock_;
  cached_remote_host_ = ss.str();

  if (!initializeSocket())
  {
    return false;
  }

  MINIROS_DEBUG("Connect succeeded to [%s:%d] on socket [%d]", host.c_str(), port, sock_);

  return true;
}